

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall
CProficiencies::GetProfsTaughtByTrainer(CProficiencies *this,char_data *ch,char_data *trainer)

{
  CHAR_DATA *args_1;
  size_t sVar1;
  long in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  int j;
  int i;
  size_t profs_taught_size;
  size_type prof_table_size;
  void *in_stack_ffffffffffffff78;
  vector<proficiency_type,_std::allocator<proficiency_type>_> *this_00;
  void *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  CHAR_DATA *ch_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  int local_40;
  int local_3c;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  char (*in_stack_ffffffffffffffe0) [20];
  
  if (in_RSI == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    CLogger::Debug<>((CLogger *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 0) {
    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    act((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
        in_stack_ffffffffffffff78,0);
    args_1 = (CHAR_DATA *)
             std::size<std::vector<proficiency_type,std::allocator<proficiency_type>>>
                       ((vector<proficiency_type,_std::allocator<proficiency_type>_> *)0x7aa35e);
    sVar1 = std::size<short,4ul>((short (*) [4])(*(long *)(in_RDX + 0x78) + 0x240));
    for (local_3c = 0; (CHAR_DATA *)(long)local_3c < args_1; local_3c = local_3c + 1) {
      for (local_40 = 0; (ulong)(long)local_40 < sVar1; local_40 = local_40 + 1) {
        if (*(short *)(*(long *)(in_RDX + 0x78) + 0x240 + (long)local_40 * 2) == local_3c) {
          this_00 = &prof_table;
          std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                    (&prof_table,(long)local_3c);
          std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                    (this_00,(long)local_3c);
          ch_00 = (CHAR_DATA *)&stack0xffffffffffffffa0;
          ::fmt::v9::sprintf<char[20],char*,int,char>
                    (in_stack_ffffffffffffffe0,(char **)in_stack_ffffffffffffffd8,(int *)args_1);
          std::__cxx11::string::c_str();
          send_to_char((char *)in_stack_ffffffffffffff90,ch_00);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        }
      }
    }
  }
  return;
}

Assistant:

void CProficiencies::GetProfsTaughtByTrainer(char_data* ch, char_data* trainer)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::GetProfsTaughtByTrainer: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	act("You may learn the following proficiencies from $N:", ch, 0, trainer, TO_CHAR);

	auto prof_table_size = std::size(prof_table);
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (auto i = 0; i < prof_table_size; i++)
	{
		for (auto j = 0; j < profs_taught_size; j++)
		{
			if (trainer->pIndexData->profs_taught[j] == i)
			{
				auto buffer = fmt::sprintf("%-16s | %d points\n\r", prof_table[i].name, prof_table[i].cost);
				send_to_char(buffer.c_str(), ch);
			}
		}
	}
}